

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::VisitComponent(cmComputeLinkDepends *this,uint c)

{
  bool bVar1;
  uint c_00;
  int iVar2;
  reference pvVar3;
  pointer this_00;
  reference this_01;
  reference pvVar4;
  cmGraphEdge *edge;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
  __end1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
  __begin1;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>_>
  *__range1;
  EdgeList *nl;
  uint c_local;
  cmComputeLinkDepends *this_local;
  
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->ComponentVisited,(ulong)c);
  if (*pvVar3 == '\0') {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->ComponentVisited,(ulong)c);
    *pvVar3 = '\x01';
    this_00 = std::
              unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
              operator->(&this->CCG);
    cmComputeComponentGraph::GetComponentGraphEdges(this_00,c);
    cmReverseRange<cmGraphEdgeList>((cmGraphEdgeList *)&__begin1);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>_>
    ::begin((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>_>
             *)&__end1);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>_>
    ::end((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>_>
           *)&edge);
    while (bVar1 = std::operator!=(&__end1,(reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                                            *)&edge), bVar1) {
      this_01 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
                ::operator*(&__end1);
      c_00 = cmGraphEdge::operator_cast_to_int(this_01);
      VisitComponent(this,c_00);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>_>
      ::operator++(&__end1);
    }
    iVar2 = this->ComponentOrderId + -1;
    this->ComponentOrderId = iVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->ComponentOrder,(ulong)c);
    *pvVar4 = iVar2;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::VisitComponent(unsigned int c)
{
  // Check if the node has already been visited.
  if (this->ComponentVisited[c]) {
    return;
  }

  // We are now visiting this component so mark it.
  this->ComponentVisited[c] = 1;

  // Visit the neighbors of the component first.
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  EdgeList const& nl = this->CCG->GetComponentGraphEdges(c);
  for (cmGraphEdge const& edge : cmReverseRange(nl)) {
    this->VisitComponent(edge);
  }

  // Assign an ordering id to this component.
  this->ComponentOrder[c] = --this->ComponentOrderId;
}